

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::~Stack
          (Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *this)

{
  VariableRegion *this_00;
  
  this_00 = this->_cursor;
  while (this_00 != this->_stack) {
    this_00 = this_00 + -1;
    CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                    *)this_00);
  }
  if (this_00 != (VariableRegion *)0x0) {
    Lib::free(this->_stack);
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }